

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx2.cpp
# Opt level: O3

void ncnn::im2col_sgemm_pack8to1_int8_sse_avx2
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  undefined1 auVar1 [16];
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  int *piVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  undefined1 (*pauVar12) [16];
  ulong uVar13;
  uint uVar14;
  void *pvVar15;
  void *pvVar16;
  undefined4 *puVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  undefined8 *puVar21;
  undefined1 (*pauVar22) [32];
  int nn;
  ulong uVar23;
  undefined1 (*pauVar24) [16];
  undefined8 *puVar25;
  undefined1 (*pauVar26) [32];
  undefined4 *puVar27;
  int iVar28;
  int iVar29;
  uint uVar30;
  long lVar31;
  undefined4 *puVar32;
  ulong uVar33;
  undefined4 *puVar34;
  long lVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [64];
  undefined1 auVar40 [32];
  undefined1 auVar41 [64];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [64];
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [64];
  undefined1 auVar51 [32];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [32];
  undefined1 auVar55 [64];
  undefined1 local_b8 [64];
  size_t local_78;
  Mat *local_70;
  Mat *local_68;
  ulong local_60;
  ulong local_58;
  long local_50;
  long local_48;
  void *local_40;
  ulong local_38;
  
  uVar2 = bottom_im2col->w;
  uVar33 = (ulong)(int)uVar2;
  iVar18 = bottom_im2col->h;
  uVar11 = bottom_im2col->c;
  uVar13 = (ulong)uVar11;
  local_60 = (ulong)top_blob->c;
  local_78 = 0;
  local_b8._0_8_ = (void *)0x0;
  local_b8._8_4_ = 0;
  local_b8._12_4_ = 0;
  local_b8._16_8_ = 0;
  local_b8._24_4_ = 0;
  local_b8._32_8_ = (Allocator *)0x0;
  local_b8._40_4_ = 0;
  local_b8._44_4_ = 0;
  local_b8._48_12_ = SUB1612((undefined1  [16])0x0,4);
  if ((long)uVar33 < 4) {
    uVar9 = uVar2;
    iVar28 = iVar18;
    if (1 < (int)uVar2) {
      iVar28 = iVar18 * 2;
      uVar9 = (uVar2 & 1) + 1;
    }
  }
  else {
    uVar9 = (uVar2 & 1) + (uVar2 >> 2) + (uint)((uVar2 >> 1 & 1) != 0);
    iVar28 = iVar18 * 4;
  }
  local_70 = top_blob;
  local_68 = kernel;
  Mat::create((Mat *)local_b8,iVar28,uVar11,uVar9,8,8,opt->workspace_allocator);
  uVar9 = (int)uVar2 >> 2;
  if (0 < (int)uVar9) {
    lVar19 = 0;
    uVar20 = 0;
    do {
      if (0 < (int)uVar11) {
        pauVar22 = (undefined1 (*) [32])(local_78 * uVar20 * local_b8._16_8_ + local_b8._0_8_);
        uVar23 = 0;
        do {
          if (0 < iVar18) {
            pauVar26 = (undefined1 (*) [32])
                       ((long)bottom_im2col->data +
                       bottom_im2col->cstep * bottom_im2col->elemsize * uVar23 + lVar19);
            iVar28 = iVar18;
            do {
              *pauVar22 = *pauVar26;
              pauVar22 = pauVar22 + 1;
              pauVar26 = (undefined1 (*) [32])(*pauVar26 + (ulong)uVar2 * 8);
              iVar28 = iVar28 + -1;
            } while (iVar28 != 0);
          }
          uVar23 = uVar23 + 1;
        } while (uVar23 != uVar13);
      }
      uVar20 = uVar20 + 1;
      lVar19 = lVar19 + 0x20;
    } while (uVar20 != uVar9);
  }
  uVar14 = uVar2 >> 1 & 1;
  if ((uVar14 != 0) && (0 < (int)uVar11)) {
    pauVar12 = (undefined1 (*) [16])((long)(int)uVar9 * local_78 * local_b8._16_8_ + local_b8._0_8_)
    ;
    uVar20 = 0;
    do {
      if (0 < iVar18) {
        pauVar24 = (undefined1 (*) [16])
                   ((long)bottom_im2col->data +
                   bottom_im2col->cstep * bottom_im2col->elemsize * uVar20 +
                   (uVar33 & 0xfffffffffffffffc) * 8);
        iVar28 = iVar18;
        do {
          *pauVar12 = *pauVar24;
          pauVar12 = pauVar12 + 1;
          pauVar24 = (undefined1 (*) [16])(*pauVar24 + uVar33 * 8);
          iVar28 = iVar28 + -1;
        } while (iVar28 != 0);
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 != uVar13);
  }
  iVar28 = (int)(uVar33 & 0xfffffffffffffffc) + uVar14 * 2;
  if (iVar28 < (int)uVar2) {
    uVar20 = (ulong)iVar28;
    pvVar15 = (void *)(uVar20 * 8 + (long)bottom_im2col->data);
    do {
      if (0 < (int)uVar11) {
        iVar10 = (int)uVar20;
        iVar28 = iVar10 + 3;
        if (-1 < iVar10) {
          iVar28 = iVar10;
        }
        puVar21 = (undefined8 *)
                  ((long)(int)((int)((char)((char)uVar20 - ((byte)iVar28 & 0xfc)) / '\x02') +
                              (iVar28 >> 2) +
                              (iVar10 - (((uint)(uVar20 >> 0x1f) & 1) + iVar10 & 0xfffffffe))) *
                   local_78 * local_b8._16_8_ + local_b8._0_8_);
        uVar23 = 0;
        do {
          if (0 < iVar18) {
            puVar25 = (undefined8 *)
                      (bottom_im2col->cstep * bottom_im2col->elemsize * uVar23 + (long)pvVar15);
            iVar28 = iVar18;
            do {
              *puVar21 = *puVar25;
              puVar21 = puVar21 + 1;
              puVar25 = puVar25 + uVar33;
              iVar28 = iVar28 + -1;
            } while (iVar28 != 0);
          }
          uVar23 = uVar23 + 1;
        } while (uVar23 != uVar13);
      }
      uVar20 = uVar20 + 1;
      pvVar15 = (void *)((long)pvVar15 + 8);
    } while (uVar20 != uVar33);
  }
  uVar9 = (int)local_60 >> 2;
  if (0 < (int)uVar9) {
    local_40 = local_70->data;
    local_48 = local_70->elemsize * local_70->cstep;
    lVar19 = local_b8._16_8_ * local_78;
    pvVar15 = local_68->data;
    local_50 = local_68->elemsize * local_68->cstep;
    iVar28 = uVar11 * iVar18;
    local_58 = (ulong)uVar9;
    uVar13 = 0;
    do {
      local_38 = uVar13;
      puVar32 = (undefined4 *)(local_38 * 4 * local_48 + (long)local_40);
      puVar34 = (undefined4 *)((local_38 * 4 + 1) * local_48 + (long)local_40);
      puVar17 = (undefined4 *)((local_38 * 4 + 2) * local_48 + (long)local_40);
      puVar27 = (undefined4 *)((local_38 * 4 + 3) * local_48 + (long)local_40);
      if ((int)uVar2 < 4) {
        uVar13 = 0;
      }
      else {
        uVar20 = 0;
        pvVar16 = (void *)local_b8._0_8_;
        do {
          if (iVar28 < 1) {
            auVar38 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar40 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar43 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar46 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar51 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar44 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar54 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar49 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          }
          else {
            auVar50 = ZEXT1664((undefined1  [16])0x0);
            lVar31 = 0;
            auVar55 = ZEXT1664((undefined1  [16])0x0);
            auVar53 = ZEXT1664((undefined1  [16])0x0);
            auVar52 = ZEXT1664((undefined1  [16])0x0);
            auVar47 = ZEXT1664((undefined1  [16])0x0);
            auVar45 = ZEXT1664((undefined1  [16])0x0);
            auVar41 = ZEXT1664((undefined1  [16])0x0);
            auVar39 = ZEXT1664((undefined1  [16])0x0);
            iVar10 = iVar28;
            do {
              auVar44 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)pvVar16 + lVar31));
              auVar43 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)pvVar15 + lVar31));
              auVar38 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)pvVar15 + lVar31 + 0x10));
              auVar49 = vpmaddwd_avx2(auVar44,auVar43);
              auVar49 = vpaddd_avx2(auVar49,auVar50._0_32_);
              auVar50 = ZEXT3264(auVar49);
              auVar51 = vpermq_avx2(auVar44,0x4e);
              auVar54 = vpmaddwd_avx2(auVar51,auVar43);
              auVar54 = vpaddd_avx2(auVar54,auVar55._0_32_);
              auVar55 = ZEXT3264(auVar54);
              auVar44 = vpmaddwd_avx2(auVar44,auVar38);
              auVar44 = vpaddd_avx2(auVar44,auVar53._0_32_);
              auVar53 = ZEXT3264(auVar44);
              auVar51 = vpmaddwd_avx2(auVar51,auVar38);
              auVar40 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)pvVar16 + lVar31 + 0x10));
              auVar51 = vpaddd_avx2(auVar51,auVar52._0_32_);
              auVar52 = ZEXT3264(auVar51);
              auVar46 = vpmaddwd_avx2(auVar40,auVar43);
              auVar46 = vpaddd_avx2(auVar46,auVar47._0_32_);
              auVar47 = ZEXT3264(auVar46);
              auVar7 = vpermq_avx2(auVar40,0x4e);
              auVar43 = vpmaddwd_avx2(auVar7,auVar43);
              auVar43 = vpaddd_avx2(auVar43,auVar45._0_32_);
              auVar45 = ZEXT3264(auVar43);
              auVar40 = vpmaddwd_avx2(auVar40,auVar38);
              auVar40 = vpaddd_avx2(auVar40,auVar41._0_32_);
              auVar41 = ZEXT3264(auVar40);
              auVar38 = vpmaddwd_avx2(auVar7,auVar38);
              auVar38 = vpaddd_avx2(auVar38,auVar39._0_32_);
              auVar39 = ZEXT3264(auVar38);
              lVar31 = lVar31 + 0x20;
              iVar10 = iVar10 + -1;
            } while (iVar10 != 0);
          }
          auVar7 = vpunpckldq_avx2(auVar49,auVar54);
          auVar6 = vpunpckldq_avx2(auVar44,auVar51);
          auVar54 = vpunpckhdq_avx2(auVar49,auVar54);
          auVar44 = vpunpckhdq_avx2(auVar44,auVar51);
          auVar51 = vpunpcklqdq_avx2(auVar7,auVar6);
          auVar49 = vpunpckhqdq_avx2(auVar7,auVar6);
          auVar49 = vpaddd_avx2(auVar51,auVar49);
          auVar51 = vpunpcklqdq_avx2(auVar54,auVar44);
          auVar54 = vpunpckhqdq_avx2(auVar54,auVar44);
          auVar54 = vpaddd_avx2(auVar54,auVar51);
          auVar49 = vpaddd_avx2(auVar49,auVar54);
          auVar54 = vpunpckldq_avx2(auVar46,auVar43);
          auVar7 = vpunpckldq_avx2(auVar40,auVar38);
          auVar44 = vpunpckhdq_avx2(auVar46,auVar43);
          auVar51 = vpunpckhdq_avx2(auVar40,auVar38);
          auVar46 = vpunpcklqdq_avx2(auVar54,auVar7);
          auVar54 = vpunpckhqdq_avx2(auVar54,auVar7);
          *puVar32 = auVar49._0_4_;
          *puVar34 = auVar49._20_4_;
          *puVar17 = auVar49._8_4_;
          *puVar27 = auVar49._28_4_;
          puVar32[1] = auVar49._4_4_;
          auVar54 = vpaddd_avx2(auVar46,auVar54);
          auVar46 = vpunpcklqdq_avx2(auVar44,auVar51);
          auVar44 = vpunpckhqdq_avx2(auVar44,auVar51);
          puVar34[1] = auVar49._16_4_;
          puVar17[1] = auVar49._12_4_;
          puVar27[1] = auVar49._24_4_;
          auVar49 = vpaddd_avx2(auVar44,auVar46);
          auVar49 = vpaddd_avx2(auVar54,auVar49);
          puVar32[2] = auVar49._0_4_;
          puVar34[2] = auVar49._20_4_;
          puVar17[2] = auVar49._8_4_;
          puVar27[2] = auVar49._28_4_;
          puVar32[3] = auVar49._4_4_;
          puVar34[3] = auVar49._16_4_;
          puVar17[3] = auVar49._12_4_;
          puVar27[3] = auVar49._24_4_;
          puVar32 = puVar32 + 4;
          puVar34 = puVar34 + 4;
          puVar17 = puVar17 + 4;
          puVar27 = puVar27 + 4;
          uVar13 = uVar20 + 4;
          lVar31 = uVar20 + 7;
          pvVar16 = (void *)((long)pvVar16 + lVar19);
          uVar20 = uVar13;
        } while (lVar31 < (long)uVar33);
      }
      if ((int)((uint)uVar13 | 1) < (int)uVar2) {
        uVar9 = 0;
        do {
          iVar10 = (int)uVar13;
          if (iVar28 < 1) {
            auVar51 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar44 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar54 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar49 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          }
          else {
            auVar39 = ZEXT1664((undefined1  [16])0x0);
            lVar31 = 0;
            auVar47 = ZEXT1664((undefined1  [16])0x0);
            auVar45 = ZEXT1664((undefined1  [16])0x0);
            auVar41 = ZEXT1664((undefined1  [16])0x0);
            iVar29 = iVar28;
            do {
              auVar44 = vpmovsxbw_avx2(*(undefined1 (*) [16])
                                        (local_b8._0_8_ +
                                        lVar31 + (ulong)((uVar9 & 1) +
                                                        ((uint)(uVar13 >> 2) & 0x3fffffff)) * lVar19
                                        ));
              auVar54 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)pvVar15 + lVar31 * 2));
              auVar51 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)pvVar15 + lVar31 * 2 + 0x10));
              auVar49 = vpmaddwd_avx2(auVar44,auVar54);
              auVar49 = vpaddd_avx2(auVar49,auVar39._0_32_);
              auVar39 = ZEXT3264(auVar49);
              auVar46 = vpermq_avx2(auVar44,0x4e);
              auVar54 = vpmaddwd_avx2(auVar46,auVar54);
              auVar54 = vpaddd_avx2(auVar54,auVar47._0_32_);
              auVar47 = ZEXT3264(auVar54);
              auVar44 = vpmaddwd_avx2(auVar44,auVar51);
              auVar44 = vpaddd_avx2(auVar44,auVar45._0_32_);
              auVar45 = ZEXT3264(auVar44);
              auVar51 = vpmaddwd_avx2(auVar46,auVar51);
              auVar51 = vpaddd_avx2(auVar51,auVar41._0_32_);
              auVar41 = ZEXT3264(auVar51);
              lVar31 = lVar31 + 0x10;
              iVar29 = iVar29 + -1;
            } while (iVar29 != 0);
          }
          auVar46 = vpunpckldq_avx2(auVar49,auVar54);
          auVar43 = vpunpckldq_avx2(auVar44,auVar51);
          auVar54 = vpunpckhdq_avx2(auVar49,auVar54);
          auVar44 = vpunpckhdq_avx2(auVar44,auVar51);
          auVar51 = vpunpcklqdq_avx2(auVar46,auVar43);
          auVar49 = vpunpckhqdq_avx2(auVar46,auVar43);
          auVar49 = vpaddd_avx2(auVar51,auVar49);
          auVar51 = vpunpcklqdq_avx2(auVar54,auVar44);
          auVar54 = vpunpckhqdq_avx2(auVar54,auVar44);
          auVar54 = vpaddd_avx2(auVar54,auVar51);
          auVar49 = vpaddd_avx2(auVar49,auVar54);
          *puVar32 = auVar49._0_4_;
          *puVar34 = auVar49._20_4_;
          *puVar17 = auVar49._8_4_;
          *puVar27 = auVar49._28_4_;
          puVar32[1] = auVar49._4_4_;
          puVar34[1] = auVar49._16_4_;
          puVar17[1] = auVar49._12_4_;
          puVar27[1] = auVar49._24_4_;
          puVar32 = puVar32 + 2;
          puVar34 = puVar34 + 2;
          puVar17 = puVar17 + 2;
          puVar27 = puVar27 + 2;
          uVar13 = (ulong)(iVar10 + 2);
          uVar9 = (uint)(byte)((char)uVar9 + 1);
        } while (iVar10 + 3 < (int)uVar2);
      }
      else {
        uVar13 = uVar13 & 0xffffffff;
      }
      if ((int)uVar13 < (int)uVar2) {
        do {
          uVar9 = (uint)uVar13;
          if (iVar28 < 1) {
            auVar49 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar54 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          }
          else {
            auVar39 = ZEXT1664((undefined1  [16])0x0);
            lVar31 = 0;
            auVar41 = ZEXT1664((undefined1  [16])0x0);
            iVar10 = iVar28;
            do {
              auVar37._8_8_ = 0;
              auVar37._0_8_ =
                   *(ulong *)(local_b8._0_8_ +
                             lVar31 + (ulong)((uVar9 & 1) + (int)(uVar13 >> 2) +
                                             (uint)((uVar9 >> 1 & 1) != 0)) * lVar19);
              auVar37 = vpmovsxbw_avx(auVar37);
              auVar49 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)pvVar15 + lVar31 * 4));
              auVar54 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)pvVar15 + lVar31 * 4 + 0x10));
              auVar44._0_16_ = ZEXT116(0) * auVar37 + ZEXT116(1) * auVar37;
              auVar44._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar37
              ;
              auVar49 = vpmaddwd_avx2(auVar44,auVar49);
              auVar49 = vpaddd_avx2(auVar49,auVar41._0_32_);
              auVar41 = ZEXT3264(auVar49);
              auVar54 = vpmaddwd_avx2(auVar44,auVar54);
              auVar54 = vpaddd_avx2(auVar54,auVar39._0_32_);
              auVar39 = ZEXT3264(auVar54);
              lVar31 = lVar31 + 8;
              iVar10 = iVar10 + -1;
            } while (iVar10 != 0);
          }
          auVar37 = vpunpckldq_avx(auVar49._0_16_,auVar49._16_16_);
          auVar42 = vpunpckldq_avx(auVar54._0_16_,auVar54._16_16_);
          auVar48 = vpunpckhdq_avx(auVar49._0_16_,auVar49._16_16_);
          auVar36 = vpunpckhdq_avx(auVar54._0_16_,auVar54._16_16_);
          auVar5 = vpunpcklqdq_avx(auVar37,auVar42);
          auVar37 = vpunpckhqdq_avx(auVar37,auVar42);
          auVar37 = vpaddd_avx(auVar5,auVar37);
          auVar42 = vpunpcklqdq_avx(auVar48,auVar36);
          auVar48 = vpunpckhqdq_avx(auVar48,auVar36);
          auVar48 = vpaddd_avx(auVar48,auVar42);
          auVar37 = vpaddd_avx(auVar37,auVar48);
          *puVar32 = auVar37._0_4_;
          *puVar34 = auVar37._4_4_;
          *puVar17 = auVar37._8_4_;
          *puVar27 = auVar37._12_4_;
          puVar32 = puVar32 + 1;
          puVar34 = puVar34 + 1;
          puVar17 = puVar17 + 1;
          puVar27 = puVar27 + 1;
          uVar13 = (ulong)(uVar9 + 1);
        } while (uVar9 + 1 != uVar2);
      }
      pvVar15 = (void *)((long)pvVar15 + local_50);
      uVar13 = local_38 + 1;
    } while (local_38 + 1 != local_58);
  }
  uVar13 = local_60 & 0xfffffffffffffffc;
  if ((int)uVar13 != (int)local_60) {
    pvVar15 = local_70->data;
    sVar3 = local_70->elemsize;
    sVar4 = local_70->cstep;
    lVar19 = local_b8._16_8_ * local_78;
    pvVar16 = local_68->data;
    lVar31 = local_68->elemsize * local_68->cstep;
    iVar18 = iVar18 * uVar11;
    do {
      pauVar12 = (undefined1 (*) [16])(sVar3 * sVar4 * uVar13 + (long)pvVar15);
      uVar11 = (uint)uVar13;
      if ((int)uVar2 < 4) {
        uVar20 = 0;
      }
      else {
        uVar9 = uVar11 + 3;
        if (-1 < (int)uVar11) {
          uVar9 = uVar11;
        }
        uVar23 = 0;
        do {
          if (iVar18 < 1) {
            auVar49 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar54 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          }
          else {
            pauVar24 = (undefined1 (*) [16])((uVar23 >> 2) * lVar19 + local_b8._0_8_);
            auVar39 = ZEXT1664((undefined1  [16])0x0);
            lVar35 = 0;
            auVar41 = ZEXT1664((undefined1  [16])0x0);
            do {
              auVar49 = vpmovsxbw_avx2(*pauVar24);
              auVar54 = vpmovsxbw_avx2(pauVar24[1]);
              auVar48._8_8_ = 0;
              auVar48._0_8_ =
                   *(ulong *)((long)pvVar16 +
                             lVar35 * 8 +
                             (int)(((int)uVar9 >> 2) + (uVar11 - (uVar9 & 0xfffffffc))) * lVar31);
              auVar44 = vpmovsxbw_avx2(auVar48);
              auVar44 = vpermq_avx2(auVar44,0x44);
              auVar49 = vpmaddwd_avx2(auVar49,auVar44);
              auVar49 = vpaddd_avx2(auVar49,auVar41._0_32_);
              auVar41 = ZEXT3264(auVar49);
              auVar54 = vpmaddwd_avx2(auVar54,auVar44);
              auVar54 = vpaddd_avx2(auVar54,auVar39._0_32_);
              auVar39 = ZEXT3264(auVar54);
              lVar35 = lVar35 + 1;
              pauVar24 = pauVar24 + 2;
            } while (iVar18 != (int)lVar35);
          }
          auVar37 = vpshufd_avx(auVar49._0_16_,0xee);
          auVar37 = vpaddd_avx(auVar37,auVar49._0_16_);
          auVar48 = vpshufd_avx(auVar49._16_16_,0xee);
          auVar48 = vpaddd_avx(auVar48,auVar49._16_16_);
          auVar48 = vphaddd_avx(auVar37,auVar48);
          auVar37 = vpshufd_avx(auVar54._0_16_,0xee);
          auVar37 = vpaddd_avx(auVar37,auVar54._0_16_);
          auVar36 = vphaddd_avx(auVar37,auVar37);
          auVar37 = vpshufd_avx(auVar54._16_16_,0xee);
          auVar37 = vpaddd_avx(auVar37,auVar54._16_16_);
          auVar37 = vphaddd_avx(auVar37,auVar37);
          auVar48 = vpshufd_avx(auVar48,0xe8);
          auVar48 = vpunpcklqdq_avx(auVar48,auVar36);
          auVar36._0_4_ = auVar37._0_4_;
          auVar36._4_4_ = auVar36._0_4_;
          auVar36._8_4_ = auVar36._0_4_;
          auVar36._12_4_ = auVar36._0_4_;
          auVar37 = vpblendd_avx2(auVar48,auVar36,8);
          *pauVar12 = auVar37;
          pauVar12 = pauVar12 + 1;
          uVar20 = uVar23 + 4;
          lVar35 = uVar23 + 7;
          uVar23 = uVar20;
        } while (lVar35 < (long)uVar33);
      }
      uVar9 = (uint)uVar20;
      if ((int)(uVar9 | 1) < (int)uVar2) {
        uVar14 = uVar11 + 3;
        if (-1 < (int)uVar11) {
          uVar14 = uVar11;
        }
        do {
          uVar30 = (uint)uVar20;
          if (iVar18 < 1) {
            auVar49 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          }
          else {
            pauVar24 = (undefined1 (*) [16])
                       ((ulong)(((uint)(uVar20 >> 2) & 0x3fffffff) + (uint)((uVar30 >> 1 & 1) != 0))
                        * lVar19 + local_b8._0_8_);
            auVar39 = ZEXT1664((undefined1  [16])0x0);
            lVar35 = 0;
            do {
              auVar49 = vpmovsxbw_avx2(*pauVar24);
              auVar42._8_8_ = 0;
              auVar42._0_8_ =
                   *(ulong *)((long)pvVar16 +
                             lVar35 * 8 +
                             (int)(((int)uVar14 >> 2) + (uVar11 - (uVar14 & 0xfffffffc))) * lVar31);
              auVar54 = vpmovsxbw_avx2(auVar42);
              auVar54 = vpermq_avx2(auVar54,0x44);
              auVar49 = vpmaddwd_avx2(auVar49,auVar54);
              auVar49 = vpaddd_avx2(auVar49,auVar39._0_32_);
              auVar39 = ZEXT3264(auVar49);
              pauVar24 = pauVar24 + 1;
              lVar35 = lVar35 + 1;
            } while (iVar18 != (int)lVar35);
          }
          auVar37 = vpshufd_avx(auVar49._0_16_,0xee);
          auVar37 = vpaddd_avx(auVar37,auVar49._0_16_);
          auVar48 = vpshufd_avx(auVar49._16_16_,0xee);
          auVar48 = vpaddd_avx(auVar48,auVar49._16_16_);
          auVar37 = vphaddd_avx(auVar37,auVar48);
          auVar37 = vpshufd_avx(auVar37,0xe8);
          *(long *)*pauVar12 = auVar37._0_8_;
          pauVar12 = (undefined1 (*) [16])(*pauVar12 + 8);
          uVar9 = uVar30 + 2;
          uVar20 = (ulong)uVar9;
        } while ((int)(uVar30 + 3) < (int)uVar2);
      }
      if ((int)uVar9 < (int)uVar2) {
        uVar14 = uVar11 + 3;
        if (-1 < (int)uVar11) {
          uVar14 = uVar11;
        }
        do {
          if (iVar18 < 1) {
            auVar37 = (undefined1  [16])0x0;
          }
          else {
            auVar39 = ZEXT1664((undefined1  [16])0x0);
            lVar35 = 0;
            do {
              auVar5._8_8_ = 0;
              auVar5._0_8_ = *(ulong *)(local_b8._0_8_ +
                                       lVar35 * 8 +
                                       (ulong)((uVar9 & 1) + (uVar9 >> 2) +
                                              (uint)((uVar9 >> 1 & 1) != 0)) * lVar19);
              auVar37 = vpmovsxbw_avx(auVar5);
              auVar1._8_8_ = 0;
              auVar1._0_8_ = *(ulong *)((long)pvVar16 +
                                       lVar35 * 8 +
                                       (int)(((int)uVar14 >> 2) + (uVar11 - (uVar14 & 0xfffffffc)))
                                       * lVar31);
              auVar48 = vpmovsxbw_avx(auVar1);
              auVar37 = vpmaddwd_avx(auVar37,auVar48);
              auVar37 = vpaddd_avx(auVar37,auVar39._0_16_);
              auVar39 = ZEXT1664(auVar37);
              lVar35 = lVar35 + 1;
            } while (iVar18 != (int)lVar35);
          }
          auVar37 = vphaddd_avx(auVar37,auVar37);
          auVar37 = vphaddd_avx(auVar37,auVar37);
          *(int *)*pauVar12 = auVar37._0_4_;
          pauVar12 = (undefined1 (*) [16])(*pauVar12 + 4);
          uVar9 = uVar9 + 1;
        } while (uVar9 != uVar2);
      }
      uVar13 = uVar13 + 1;
    } while ((long)uVar13 < (long)local_60);
  }
  piVar8 = (int *)CONCAT44(local_b8._12_4_,local_b8._8_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if ((Allocator *)local_b8._32_8_ == (Allocator *)0x0) {
        if ((void *)local_b8._0_8_ != (void *)0x0) {
          free((void *)local_b8._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_b8._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

void im2col_sgemm_pack8to1_int8_sse_avx2(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
    im2col_sgemm_pack8to1_int8_sse(bottom_im2col, top_blob, kernel, opt);
}